

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O2

void non_empty_readdir_cb(uv_fs_t *req)

{
  void *dir;
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  
  pcVar4 = dirents[0].name;
  dir = readdir_req.ptr;
  if (req == &readdir_req) {
    if (readdir_req.fs_type == UV_FS_READDIR) {
      if (readdir_req.result == 1) {
        if (*readdir_req.ptr == dirents) {
          iVar1 = strcmp(dirents[0].name,"file1");
          if (iVar1 != 0) {
            iVar1 = strcmp(pcVar4,"file2");
            if (iVar1 != 0) {
              iVar1 = strcmp(pcVar4,"test_subdir");
              if (iVar1 != 0) {
                pcVar4 = 
                "strcmp(dirents[0].name, \"file1\") == 0 || strcmp(dirents[0].name, \"file2\") == 0 || strcmp(dirents[0].name, \"test_subdir\") == 0"
                ;
                uVar3 = 0x12d;
                goto LAB_0012bada;
              }
            }
          }
          iVar1 = strcmp(pcVar4,"test_subdir");
          if (iVar1 == 0) {
            if (dirents[0].type == UV_DIRENT_DIR) goto LAB_0012b98a;
            pcVar4 = "dirents[0].type == UV_DIRENT_DIR";
            uVar3 = 0x130;
          }
          else {
            if (dirents[0].type == UV_DIRENT_FILE) {
LAB_0012b98a:
              non_empty_readdir_cb_count = non_empty_readdir_cb_count + 1;
              uv_fs_req_cleanup(&readdir_req);
              *(uv_dirent_t **)dir = dirents;
              *(undefined8 *)((long)dir + 8) = 1;
              puVar2 = uv_default_loop();
              uv_fs_readdir(puVar2,&readdir_req,(uv_dir_t *)dir,non_empty_readdir_cb);
              return;
            }
            pcVar4 = "dirents[0].type == UV_DIRENT_FILE";
            uVar3 = 0x132;
          }
        }
        else {
          pcVar4 = "dir->dirents == dirents";
          uVar3 = 0x12a;
        }
      }
      else if (readdir_req.result == 0) {
        uv_fs_req_cleanup(&readdir_req);
        if (non_empty_readdir_cb_count == 3) {
          puVar2 = uv_default_loop();
          uv_fs_closedir(puVar2,&closedir_req,(uv_dir_t *)dir,non_empty_closedir_cb);
          return;
        }
        pcVar4 = "non_empty_readdir_cb_count == 3";
        uVar3 = 0x123;
      }
      else {
        pcVar4 = "req->result == 1";
        uVar3 = 0x129;
      }
    }
    else {
      pcVar4 = "req->fs_type == UV_FS_READDIR";
      uVar3 = 0x11e;
    }
  }
  else {
    pcVar4 = "req == &readdir_req";
    uVar3 = 0x11d;
  }
LAB_0012bada:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

static void non_empty_readdir_cb(uv_fs_t* req) {
  uv_dir_t* dir;

  ASSERT(req == &readdir_req);
  ASSERT(req->fs_type == UV_FS_READDIR);
  dir = req->ptr;

  if (req->result == 0) {
    uv_fs_req_cleanup(req);
    ASSERT(non_empty_readdir_cb_count == 3);
    uv_fs_closedir(uv_default_loop(),
                   &closedir_req,
                   dir,
                   non_empty_closedir_cb);
  } else {
    ASSERT(req->result == 1);
    ASSERT(dir->dirents == dirents);
    ASSERT(strcmp(dirents[0].name, "file1") == 0 ||
           strcmp(dirents[0].name, "file2") == 0 ||
           strcmp(dirents[0].name, "test_subdir") == 0);
#ifdef HAVE_DIRENT_TYPES
    if (!strcmp(dirents[0].name, "test_subdir"))
      ASSERT(dirents[0].type == UV_DIRENT_DIR);
    else
      ASSERT(dirents[0].type == UV_DIRENT_FILE);
#else
    ASSERT(dirents[0].type == UV_DIRENT_UNKNOWN);
#endif /* HAVE_DIRENT_TYPES */

    ++non_empty_readdir_cb_count;
    uv_fs_req_cleanup(req);
    dir->dirents = dirents;
    dir->nentries = ARRAY_SIZE(dirents);
    uv_fs_readdir(uv_default_loop(),
                  &readdir_req,
                  dir,
                  non_empty_readdir_cb);
  }
}